

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::initEmpty(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  *(undefined8 *)(this + 8) = 0;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    lVar2 = *(long *)this;
    for (lVar3 = 0; (ulong)uVar1 << 5 != lVar3; lVar3 = lVar3 + 0x20) {
      *(undefined8 *)(lVar2 + lVar3) = 0xffffffffffffffff;
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x158,
                "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, std::vector<unsigned char>>, unsigned long, std::vector<unsigned char>, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>>::initEmpty() [DerivedT = llvm::DenseMap<unsigned long, std::vector<unsigned char>>, KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }